

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tester.h
# Opt level: O0

void __thiscall MemMat<int>::MemMat(MemMat<int> *this,Size *size)

{
  int local_fc;
  Size_<int> local_f8;
  Mat_<int> local_f0;
  Size_<int> local_80;
  Mat_<int> local_78;
  Size *local_18;
  Size *size_local;
  MemMat<int> *this_local;
  
  local_18 = size;
  size_local = (Size *)this;
  cv::Mat_<int>::Mat_(&this->img_);
  cv::Mat_<int>::Mat_(&this->accesses_);
  cv::Size_<int>::Size_(&local_80,size);
  cv::Mat_<int>::Mat_(&local_78,&local_80);
  cv::Mat_<int>::operator=(&this->img_,&local_78);
  cv::Mat_<int>::~Mat_(&local_78);
  cv::Size_<int>::Size_(&local_f8,size);
  local_fc = 0;
  cv::Mat_<int>::Mat_(&local_f0,&local_f8,&local_fc);
  cv::Mat_<int>::operator=(&this->accesses_,&local_f0);
  cv::Mat_<int>::~Mat_(&local_f0);
  this->rows = size->height;
  this->cols = size->width;
  return;
}

Assistant:

MemMat(cv::Size size)
    {
        img_ = cv::Mat_<T>(size);
        accesses_ = cv::Mat1i(size, 0);
        rows = size.height;
        cols = size.width;
    }